

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
::raw_hash_set(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
               *this)

{
  ctrl_t *pcVar1;
  CustomAlloc<long> local_17;
  equal_to<long> local_16;
  Hash<long> local_15;
  int local_14;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  *local_10;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  *this_local;
  
  local_10 = this;
  pcVar1 = EmptyGroup<std::is_same<phmap::priv::(anonymous_namespace)::CustomAlloc<long>,std::allocator<long>>>
                     ();
  this->ctrl_ = pcVar1;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  local_14 = 0;
  anon_unknown_0::CustomAlloc<long>::CustomAlloc(&local_17);
  std::
  tuple<unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  ::
  tuple<int,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>,_true,_true>
            (&this->settings_,&local_14,&local_15,&local_16,&local_17);
  anon_unknown_0::CustomAlloc<long>::~CustomAlloc(&local_17);
  return;
}

Assistant:

raw_hash_set() noexcept(
        std::is_nothrow_default_constructible<hasher>::value&&
        std::is_nothrow_default_constructible<key_equal>::value&&
        std::is_nothrow_default_constructible<allocator_type>::value) {}